

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::IsPlanar(ON_LineCurve *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  uint uVar2;
  bool local_21;
  bool rc;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_LineCurve *this_local;
  
  uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
  local_21 = (bool)((byte)uVar2 & 1);
  if ((plane != (ON_Plane *)0x0) && ((uVar2 & 1) != 0)) {
    if (this->m_dim == 2) {
      local_21 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
    }
    else {
      bVar1 = ON_Line::InPlane(&this->m_line,plane,tolerance);
      if (!bVar1) {
        ON_Line::InPlane(&this->m_line,plane,0.0);
      }
    }
  }
  return local_21;
}

Assistant:

bool
ON_LineCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = IsValid();
  if ( plane != nullptr && rc ) 
  {
    if ( m_dim == 2 )
      rc = ON_Curve::IsPlanar(plane,tolerance);
    else if ( !m_line.InPlane(*plane,tolerance) )
      m_line.InPlane(*plane,0.0);
  }
  return rc;
}